

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
MultiBodyInplaceSolverIslandCallback::setup
          (MultiBodyInplaceSolverIslandCallback *this,btContactSolverInfo *solverInfo,
          btTypedConstraint **sortedConstraints,int numConstraints,
          btMultiBodyConstraint **sortedMultiBodyConstraints,int numMultiBodyConstraints,
          btIDebugDraw *debugDrawer)

{
  btPersistentManifold *local_18;
  
  this->m_solverInfo = solverInfo;
  this->m_multiBodySortedConstraints = sortedMultiBodyConstraints;
  this->m_numMultiBodyConstraints = numMultiBodyConstraints;
  this->m_sortedConstraints = sortedConstraints;
  this->m_numConstraints = numConstraints;
  this->m_debugDrawer = debugDrawer;
  local_18 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btCollisionObject_*>::resize
            (&this->m_bodies,0,(btCollisionObject **)&local_18);
  local_18 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btPersistentManifold_*>::resize(&this->m_manifolds,0,&local_18);
  local_18 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btTypedConstraint_*>::resize
            (&this->m_constraints,0,(btTypedConstraint **)&local_18);
  local_18 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btMultiBodyConstraint_*>::resize
            (&this->m_multiBodyConstraints,0,(btMultiBodyConstraint **)&local_18);
  return;
}

Assistant:

SIMD_FORCE_INLINE void setup ( btContactSolverInfo* solverInfo, btTypedConstraint** sortedConstraints, int numConstraints, btMultiBodyConstraint** sortedMultiBodyConstraints,	int	numMultiBodyConstraints,	btIDebugDraw* debugDrawer)
	{
		btAssert(solverInfo);
		m_solverInfo = solverInfo;

		m_multiBodySortedConstraints = sortedMultiBodyConstraints;
		m_numMultiBodyConstraints = numMultiBodyConstraints;
		m_sortedConstraints = sortedConstraints;
		m_numConstraints = numConstraints;

		m_debugDrawer = debugDrawer;
		m_bodies.resize (0);
		m_manifolds.resize (0);
		m_constraints.resize (0);
		m_multiBodyConstraints.resize(0);
	}